

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O2

size_t google::protobuf::internal::WireFormatLite::MessageSize<google::protobuf::Message>
                 (Message *value)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  
  uVar2 = (*(value->super_MessageLite)._vptr_MessageLite[0xb])();
  iVar1 = 0x1f;
  if ((uVar2 | 1) != 0) {
    for (; (uVar2 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  return CONCAT44(extraout_var,uVar2) + (ulong)(iVar1 * 9 + 0x49U >> 6);
}

Assistant:

inline size_t WireFormatLite::MessageSize(const MessageType& value) {
  return LengthDelimitedSize(value.ByteSizeLong());
}